

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cfd_api_json_autogen.h
# Opt level: O3

void __thiscall cfd::api::json::DecodePsbtUtxo::DecodePsbtUtxo(DecodePsbtUtxo *this)

{
  _Rb_tree_header *p_Var1;
  
  (this->super_JsonClassBase<cfd::api::json::DecodePsbtUtxo>)._vptr_JsonClassBase =
       (_func_int **)&PTR__DecodePsbtUtxo_0072fcb8;
  p_Var1 = &(this->ignore_items)._M_t._M_impl.super__Rb_tree_header;
  (this->ignore_items)._M_t._M_impl.super__Rb_tree_header._M_header._M_color = _S_red;
  (this->ignore_items)._M_t._M_impl.super__Rb_tree_header._M_header._M_parent = (_Base_ptr)0x0;
  (this->ignore_items)._M_t._M_impl.super__Rb_tree_header._M_header._M_left = &p_Var1->_M_header;
  (this->ignore_items)._M_t._M_impl.super__Rb_tree_header._M_header._M_right = &p_Var1->_M_header;
  (this->ignore_items)._M_t._M_impl.super__Rb_tree_header._M_node_count = 0;
  this->amount_ = 0;
  DecodePsbtLockingScript::DecodePsbtLockingScript(&this->script_pub_key_);
  CollectFieldName();
  return;
}

Assistant:

DecodePsbtUtxo() {
    CollectFieldName();
  }